

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyContainer.hh
# Opt level: O3

BasePropHandleT<float> __thiscall
OpenMesh::PropertyContainer::handle<float>(PropertyContainer *this,float *param_1,string *_name)

{
  pointer ppBVar1;
  pointer __s2;
  size_t __n;
  BaseProperty *pBVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  pointer ppBVar6;
  
  ppBVar6 = (this->properties_).
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppBVar1 = (this->properties_).
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppBVar6 != ppBVar1) {
    __s2 = (_name->_M_dataplus)._M_p;
    __n = _name->_M_string_length;
    iVar5 = 0;
    do {
      pBVar2 = *ppBVar6;
      if ((((pBVar2 != (BaseProperty *)0x0) && ((pBVar2->name_)._M_string_length == __n)) &&
          ((__n == 0 || (iVar3 = bcmp((pBVar2->name_)._M_dataplus._M_p,__s2,__n), iVar3 == 0)))) &&
         ((*ppBVar6 != (BaseProperty *)0x0 &&
          (lVar4 = __dynamic_cast(*ppBVar6,&BaseProperty::typeinfo,&PropertyT<float>::typeinfo,0),
          lVar4 != 0)))) {
        return (BasePropHandleT<float>)(BaseHandle)iVar5;
      }
      ppBVar6 = ppBVar6 + 1;
      iVar5 = iVar5 + 1;
    } while (ppBVar6 != ppBVar1);
  }
  return (BaseHandle)-1;
}

Assistant:

BasePropHandleT<T> handle(const T&, const std::string& _name) const
  {
    Properties::const_iterator p_it = properties_.begin();
    for (int idx=0; p_it != properties_.end(); ++p_it, ++idx)
    {
      if (*p_it != NULL &&
         (*p_it)->name() == _name  //skip deleted properties
// Skip type check
#ifndef OM_FORCE_STATIC_CAST
          && dynamic_cast<PropertyT<T>*>(properties_[idx]) != NULL //check type
#endif
         )
      {
        return BasePropHandleT<T>(idx);
      }
    }
    return BasePropHandleT<T>();
  }